

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinLYP>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               host_buffer_type eps,host_buffer_type vrho,host_buffer_type vsigma)

{
  double *sigma_ab;
  double *sigma_bb;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  double vsbb;
  double vsab;
  double vsaa;
  double vrb;
  double vra;
  double e;
  double *vsigma_i;
  double *vrho_i;
  double *sigma_i;
  double *rho_i;
  int32_t i;
  double *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    sigma_ab = (double *)(in_R8 + (long)(iVar1 << 1) * 8);
    sigma_bb = (double *)(in_R9 + (long)(iVar1 * 3) * 8);
    gga_screening_interface<ExchCXX::BuiltinLYP>::eval_exc_vxc_polar
              ((double)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
               (double)(in_RSI + (long)(iVar1 << 1) * 8),(double)(in_RDX + (long)(iVar1 * 3) * 8),
               (double)sigma_ab,(double)sigma_bb,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
               ,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70);
    *(double *)(in_RCX + (long)iVar1 * 8) =
         in_XMM0_Qa * (double)in_stack_ffffffffffffff98 + *(double *)(in_RCX + (long)iVar1 * 8);
    *sigma_ab = in_XMM0_Qa * (double)in_stack_ffffffffffffff90 + *sigma_ab;
    sigma_ab[1] = in_XMM0_Qa * (double)in_stack_ffffffffffffff88 + sigma_ab[1];
    *sigma_bb = in_XMM0_Qa * (double)in_stack_ffffffffffffff80 + *sigma_bb;
    sigma_bb[1] = in_XMM0_Qa * (double)in_stack_ffffffffffffff78 + sigma_bb[1];
    sigma_bb[2] = in_XMM0_Qa * (double)in_stack_ffffffffffffff70 + sigma_bb[2];
  }
  return;
}

Assistant:

GGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;

    double e, vra, vrb, vsaa,vsab,vsbb;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], e, vra, vrb, vsaa, vsab, vsbb );

    eps[i]      += scal_fact * e;
    vrho_i[0]   += scal_fact * vra;
    vrho_i[1]   += scal_fact * vrb;
    vsigma_i[0] += scal_fact * vsaa;
    vsigma_i[1] += scal_fact * vsab;
    vsigma_i[2] += scal_fact * vsbb;

  }

}